

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# allocator.h
# Opt level: O0

void * sx_align_ptr(void *ptr,size_t extra,uint32_t align)

{
  uintptr_t aligned;
  uintptr_t mask;
  uintptr_t unaligned;
  anon_union_8_2_61bd4320 un;
  uint32_t align_local;
  size_t extra_local;
  void *ptr_local;
  
  return (void *)((long)ptr + (align - 1) + extra & ((ulong)(align - 1) ^ 0xffffffffffffffff));
}

Assistant:

SX_INLINE void* sx_align_ptr(void* ptr, size_t extra, uint32_t align)
{
    union {
        void* ptr;
        uintptr_t addr;
    } un;
    un.ptr = ptr;
    uintptr_t unaligned = un.addr + extra;    // space for header
    uintptr_t mask = align - 1;
    uintptr_t aligned = sx_align_mask(unaligned, mask);
    un.addr = aligned;
    return un.ptr;
}